

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

int SHA1_Update(SHA_CTX *c,void *data,size_t len)

{
  uint uVar1;
  void *pvVar2;
  ulong local_30;
  size_t j;
  size_t i;
  size_t len_local;
  uint8_t *data_local;
  SHA1_CTX *context_local;
  
  local_30 = (ulong)(c->Nl >> 3 & 0x3f);
  uVar1 = c->Nl + (int)(len << 3);
  c->Nl = uVar1;
  if ((ulong)uVar1 < len << 3) {
    c->Nh = c->Nh + 1;
  }
  c->Nh = c->Nh + (int)(len >> 0x1d);
  if (local_30 + len < 0x40) {
    j = 0;
  }
  else {
    j = 0x40 - local_30;
    memcpy((void *)((long)c->data + local_30),data,j);
    SHA1Transform(&c->h0,(uint8_t *)c->data);
    for (; j + 0x3f < len; j = j + 0x40) {
      SHA1Transform(&c->h0,(uint8_t *)((long)data + j));
    }
    local_30 = 0;
  }
  pvVar2 = memcpy((void *)((long)c->data + local_30),(void *)((long)data + j),len - j);
  return (int)pvVar2;
}

Assistant:

void SHA1_Update(SHA1_CTX *context, const uint8_t *data, size_t len)
{
  size_t i, j;

  j = (context->count[0] >> 3) & 63;
  if ((context->count[0] += len << 3) < (len << 3))
    context->count[1]++;
  context->count[1] += (len >> 29);
  if ((j + len) > 63) {
    memcpy(&context->buffer[j], data, (i = 64 - j));
    SHA1Transform(context->state, context->buffer);
    for (; i + 63 < len; i += 64)
      SHA1Transform(context->state, &data[i]);
    j = 0;
  } else
    i = 0;
  memcpy(&context->buffer[j], &data[i], len - i);
}